

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::type_to_array_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t param_2)

{
  bool bVar1;
  size_t sVar2;
  CompilerError *this_00;
  string local_c8;
  int local_a8;
  undefined1 local_a2;
  allocator local_a1;
  uint32_t i_1;
  string local_80;
  string local_60;
  uint local_3c;
  undefined1 local_36;
  allocator local_35;
  uint32_t i;
  allocator local_25;
  uint32_t local_24;
  SPIRType *pSStack_20;
  uint32_t param_2_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *res;
  
  local_24 = param_2;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  if ((((type->pointer & 1U) == 0) || (type->storage != PhysicalStorageBuffer)) ||
     (type->basetype == Struct)) {
    bVar1 = VectorView<unsigned_int>::empty(&(type->array).super_VectorView<unsigned_int>);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_35);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_35);
    }
    else if (((this->options).flatten_multidimensional_arrays & 1U) == 0) {
      sVar2 = VectorView<unsigned_int>::size(&(pSStack_20->array).super_VectorView<unsigned_int>);
      if (1 < sVar2) {
        if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1ae)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&i_1,"GL_ARB_arrays_of_arrays",&local_a1);
          require_extension_internal(this,(string *)&i_1);
          ::std::__cxx11::string::~string((string *)&i_1);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        }
        else if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x136)) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,
                     "Arrays of arrays not supported before ESSL version 310. Try using --flatten-multidimensional-arrays or set options.flatten_multidimensional_arrays to true."
                    );
          __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
      local_a2 = 0;
      ::std::__cxx11::string::string((string *)__return_storage_ptr__);
      sVar2 = VectorView<unsigned_int>::size(&(pSStack_20->array).super_VectorView<unsigned_int>);
      for (local_a8 = (int)sVar2; local_a8 != 0; local_a8 = local_a8 + -1) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[");
        to_array_size_abi_cxx11_(&local_c8,this,pSStack_20,local_a8 - 1);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c8);
        ::std::__cxx11::string::~string((string *)&local_c8);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
      }
    }
    else {
      local_36 = 0;
      ::std::__cxx11::string::string((string *)__return_storage_ptr__);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[");
      sVar2 = VectorView<unsigned_int>::size(&(pSStack_20->array).super_VectorView<unsigned_int>);
      for (local_3c = (uint)sVar2; local_3c != 0; local_3c = local_3c - 1) {
        to_array_size_abi_cxx11_(&local_80,this,pSStack_20,local_3c - 1);
        enclose_expression(&local_60,this,&local_80);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        ::std::__cxx11::string::~string((string *)&local_80);
        if (1 < local_3c) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__," * ");
        }
      }
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_25);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::type_to_array_glsl(const SPIRType &type, uint32_t)
{
	if (type.pointer && type.storage == StorageClassPhysicalStorageBufferEXT && type.basetype != SPIRType::Struct)
	{
		// We are using a wrapped pointer type, and we should not emit any array declarations here.
		return "";
	}

	if (type.array.empty())
		return "";

	if (options.flatten_multidimensional_arrays)
	{
		string res;
		res += "[";
		for (auto i = uint32_t(type.array.size()); i; i--)
		{
			res += enclose_expression(to_array_size(type, i - 1));
			if (i > 1)
				res += " * ";
		}
		res += "]";
		return res;
	}
	else
	{
		if (type.array.size() > 1)
		{
			if (!options.es && options.version < 430)
				require_extension_internal("GL_ARB_arrays_of_arrays");
			else if (options.es && options.version < 310)
				SPIRV_CROSS_THROW("Arrays of arrays not supported before ESSL version 310. "
				                  "Try using --flatten-multidimensional-arrays or set "
				                  "options.flatten_multidimensional_arrays to true.");
		}

		string res;
		for (auto i = uint32_t(type.array.size()); i; i--)
		{
			res += "[";
			res += to_array_size(type, i - 1);
			res += "]";
		}
		return res;
	}
}